

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O0

void __thiscall
kj::_::Debug::Fault::
Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long_long&,unsigned_long_long&>&,char_const(&)[19],unsigned_long_long&,unsigned_long_long&>
          (Fault *this,char *file,int line,Type code,char *condition,char *macroArgs,
          DebugComparison<unsigned_long_long_&,_unsigned_long_long_&> *params,char (*params_1) [19],
          unsigned_long_long *params_2,unsigned_long_long *params_3)

{
  undefined4 in_register_00000014;
  char (*params_00) [19];
  unsigned_long_long *params_01;
  unsigned_long_long *params_02;
  ArrayDisposer **local_100;
  undefined1 local_98 [8];
  String argValues [4];
  char *macroArgs_local;
  char *condition_local;
  Type code_local;
  int line_local;
  char *file_local;
  Fault *this_local;
  
  this->exception = (Exception *)0x0;
  str<kj::_::DebugComparison<unsigned_long_long&,unsigned_long_long&>&>
            ((String *)local_98,(kj *)params,
             (DebugComparison<unsigned_long_long_&,_unsigned_long_long_&> *)
             CONCAT44(in_register_00000014,line));
  str<char_const(&)[19]>((String *)&argValues[0].content.disposer,(kj *)params_1,params_00);
  str<unsigned_long_long&>((String *)&argValues[1].content.disposer,(kj *)params_2,params_01);
  str<unsigned_long_long&>((String *)&argValues[2].content.disposer,(kj *)params_3,params_02);
  arrayPtr<kj::String>((String *)local_98,4);
  init(this,(EVP_PKEY_CTX *)file);
  local_100 = &argValues[3].content.disposer;
  do {
    local_100 = local_100 + -3;
    String::~String((String *)local_100);
  } while (local_100 != (ArrayDisposer **)local_98);
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}